

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

ArrayPtr<const_capnp::word>
capnp::initMessageBuilderFromFlatArrayCopy
          (ArrayPtr<const_capnp::word> array,MessageBuilder *target,ReaderOptions options)

{
  PointerReader other;
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> AVar3;
  FlatArrayMessageReader reader;
  Reader local_158;
  PointerBuilder local_138;
  FlatArrayMessageReader local_120;
  
  FlatArrayMessageReader::FlatArrayMessageReader(&local_120,array,options);
  MessageReader::getRootInternal(&local_158,&local_120.super_MessageReader);
  MessageBuilder::getRootInternal((Builder *)&local_138,target);
  other.capTable = local_158.reader.capTable;
  other.segment = local_158.reader.segment;
  other.pointer = local_158.reader.pointer;
  other.nestingLimit = local_158.reader.nestingLimit;
  other._28_4_ = local_158.reader._28_4_;
  _::PointerBuilder::copyFrom(&local_138,other,false);
  sVar2 = local_120.moreSegments.size_;
  pAVar1 = local_120.moreSegments.ptr;
  local_120.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0028e2c0;
  if (local_120.moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_120.moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_120.moreSegments.size_ = 0;
    (**(local_120.moreSegments.disposer)->_vptr_ArrayDisposer)
              (local_120.moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_120);
  AVar3.size_ = (long)((long)array.ptr + (array.size_ * 8 - (long)local_120.end)) >> 3;
  AVar3.ptr = local_120.end;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const word> initMessageBuilderFromFlatArrayCopy(
    kj::ArrayPtr<const word> array, MessageBuilder& target, ReaderOptions options) {
  FlatArrayMessageReader reader(array, options);
  target.setRoot(reader.getRoot<AnyPointer>());
  return kj::arrayPtr(reader.getEnd(), array.end());
}